

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O2

sFace * __thiscall gjkepa2_impl::EPA::newface(EPA *this,sSV *a,sSV *b,sSV *c,bool forced)

{
  btVector3 *v2;
  btScalar *dist;
  sFace *face;
  _ _Var1;
  bool bVar2;
  btScalar bVar3;
  btScalar bVar4;
  btVector3 bVar5;
  btScalar l;
  undefined1 auStack_4c [12];
  btVector3 local_40;
  
  face = (this->m_stock).root;
  if (face == (sFace *)0x0) {
    this->m_status = OutOfFaces;
  }
  else {
    remove((EPA *)&this->m_stock,(char *)face);
    append(&this->m_hull,face);
    face->pass = '\0';
    face->c[0] = a;
    face->c[1] = b;
    face->c[2] = c;
    v2 = &a->w;
    _l = operator-(&b->w,v2);
    local_40 = operator-(&c->w,v2);
    bVar5 = btVector3::cross((btVector3 *)&l,&local_40);
    *&(face->n).m_floats = bVar5.m_floats;
    bVar3 = btVector3::length(&face->n);
    l = bVar3;
    if (bVar3 <= 0.0001) {
      _Var1 = Degenerated;
    }
    else {
      dist = &face->d;
      bVar2 = getedgedist(this,face,a,b,dist);
      if (((!bVar2) && (bVar2 = getedgedist(this,face,b,c,dist), !bVar2)) &&
         (bVar2 = getedgedist(this,face,c,a,dist), !bVar2)) {
        bVar4 = btVector3::dot(v2,&face->n);
        face->d = bVar4 / bVar3;
      }
      btVector3::operator/=(&face->n,&l);
      if (forced) {
        return face;
      }
      if (-1e-05 <= *dist) {
        return face;
      }
      _Var1 = NonConvex;
    }
    this->m_status = _Var1;
    remove((EPA *)&this->m_hull,(char *)face);
    append(&this->m_stock,face);
  }
  return (sFace *)0x0;
}

Assistant:

sFace*				newface(sSV* a,sSV* b,sSV* c,bool forced)
			{
				if(m_stock.root)
				{
					sFace*	face=m_stock.root;
					remove(m_stock,face);
					append(m_hull,face);
					face->pass	=	0;
					face->c[0]	=	a;
					face->c[1]	=	b;
					face->c[2]	=	c;
					face->n		=	btCross(b->w-a->w,c->w-a->w);
					const btScalar	l=face->n.length();
					const bool		v=l>EPA_ACCURACY;

					if(v)
					{
						if(!(getedgedist(face, a, b, face->d) ||
							 getedgedist(face, b, c, face->d) ||
							 getedgedist(face, c, a, face->d)))
						{
							// Origin projects to the interior of the triangle
							// Use distance to triangle plane
							face->d = btDot(a->w, face->n) / l;
						}

						face->n /= l;
						if(forced || (face->d >= -EPA_PLANE_EPS))
						{
							return face;
						}
						else
							m_status=eStatus::NonConvex;
					}
					else
						m_status=eStatus::Degenerated;

					remove(m_hull, face);
					append(m_stock, face);
					return 0;

				}
				m_status = m_stock.root ? eStatus::OutOfVertices : eStatus::OutOfFaces;
				return 0;
			}